

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

size_t quicly_send_stateless_reset(quicly_context_t *ctx,void *src_cid,void *payload)

{
  int iVar1;
  byte *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  uint8_t *base;
  size_t local_8;
  
  (**(code **)*in_RDI)(in_RDX,0x17);
  *in_RDX = *in_RDX & 0x7f | 0x40;
  iVar1 = (**(code **)(in_RDI[0x15] + 0x10))(in_RDI[0x15],in_RDX + 0x17,in_RSI);
  if (iVar1 == 0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = 0x27;
  }
  return local_8;
}

Assistant:

size_t quicly_send_stateless_reset(quicly_context_t *ctx, const void *src_cid, void *payload)
{
    uint8_t *base = payload;

    /* build stateless reset packet */
    ctx->tls->random_bytes(base, QUICLY_STATELESS_RESET_PACKET_MIN_LEN - QUICLY_STATELESS_RESET_TOKEN_LEN);
    base[0] = (base[0] & ~QUICLY_LONG_HEADER_BIT) | QUICLY_QUIC_BIT;
    if (!ctx->cid_encryptor->generate_stateless_reset_token(
            ctx->cid_encryptor, base + QUICLY_STATELESS_RESET_PACKET_MIN_LEN - QUICLY_STATELESS_RESET_TOKEN_LEN, src_cid))
        return SIZE_MAX;

    return QUICLY_STATELESS_RESET_PACKET_MIN_LEN;
}